

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O0

Channel * __thiscall Imf_2_5::ChannelList::findChannel(ChannelList *this,char *name)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator i;
  map<Imf_2_5::Name,_Imf_2_5::Channel,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  *in_stack_fffffffffffffec8;
  Name *in_stack_fffffffffffffed0;
  Channel *pCVar3;
  _Self local_120 [33];
  _Self local_18 [3];
  
  Name::Name(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_2_5::Name,_Imf_2_5::Channel,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
       ::find(in_stack_fffffffffffffec8,(key_type *)0x76db15);
  local_120[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_2_5::Name,_Imf_2_5::Channel,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
       ::end(in_stack_fffffffffffffec8);
  bVar1 = std::operator==(local_18,local_120);
  if (bVar1) {
    pCVar3 = (Channel *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>
                         *)in_stack_fffffffffffffed0);
    pCVar3 = &ppVar2->second;
  }
  return pCVar3;
}

Assistant:

const Channel *
ChannelList::findChannel (const char name[]) const
{
    ChannelMap::const_iterator i = _map.find (name);
    return (i == _map.end())? 0: &i->second;
}